

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,unsigned_int>::
load_impl_sequence<0ul,1ul>
          (argument_loader<pybind11::detail::value_and_holder&,unsigned_int> *this,long call)

{
  char *pcVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  bool bVar5;
  char local_1;
  
  puVar3 = *(undefined8 **)(call + 8);
  uVar2 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 8) = *puVar3;
  type_caster<unsigned_int,_void>::load
            ((type_caster<unsigned_int,_void> *)this,(PyObject *)puVar3[1],SUB41((uVar2 & 2) >> 1,0)
            );
  lVar4 = 0;
  do {
    bVar5 = lVar4 == 1;
    if (bVar5) {
      return bVar5;
    }
    pcVar1 = &local_1 + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  return bVar5;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }